

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_nested_loop_join.cpp
# Opt level: O2

void __thiscall
duckdb::NestedLoopJoinGlobalScanState::~NestedLoopJoinGlobalScanState
          (NestedLoopJoinGlobalScanState *this)

{
  ~NestedLoopJoinGlobalScanState(this);
  operator_delete(this);
  return;
}

Assistant:

explicit NestedLoopJoinGlobalScanState(const PhysicalNestedLoopJoin &op) : op(op) {
		D_ASSERT(op.sink_state);
		auto &sink = op.sink_state->Cast<NestedLoopJoinGlobalState>();
		sink.right_outer.InitializeScan(sink.right_payload_data, scan_state);
	}